

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O0

bool __thiscall QSqlTableModel::isDirty(QSqlTableModel *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  Op OVar3;
  ModifiedRow *this_00;
  QSqlRecord *this_01;
  QModelIndex *in_RSI;
  long in_FS_OFFSET;
  ModifiedRow *row;
  QSqlTableModelPrivate *d;
  const_iterator it;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QModelIndex *in_stack_ffffffffffffffa0;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QSqlTableModel *)0x16da0a);
  bVar2 = QModelIndex::isValid(in_stack_ffffffffffffffa0);
  if (bVar2) {
    QModelIndex::row(in_RSI);
    QMap<int,_QSqlTableModelPrivate::ModifiedRow>::constFind
              ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),(int *)0x16da60);
    QMap<int,_QSqlTableModelPrivate::ModifiedRow>::constEnd
              ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    bVar2 = ::operator==((const_iterator *)in_stack_ffffffffffffffa0,
                         (const_iterator *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (bVar2) {
      local_21 = false;
    }
    else {
      this_00 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::const_iterator::operator*
                          ((const_iterator *)0x16dab3);
      bVar2 = QSqlTableModelPrivate::ModifiedRow::submitted(this_00);
      if (bVar2) {
        local_21 = false;
      }
      else {
        OVar3 = QSqlTableModelPrivate::ModifiedRow::op(this_00);
        local_51 = true;
        if (OVar3 != Insert) {
          OVar3 = QSqlTableModelPrivate::ModifiedRow::op(this_00);
          local_51 = true;
          if (OVar3 != Delete) {
            OVar3 = QSqlTableModelPrivate::ModifiedRow::op(this_00);
            local_52 = false;
            if (OVar3 == Update) {
              this_01 = QSqlTableModelPrivate::ModifiedRow::rec(this_00);
              QModelIndex::column(in_RSI);
              local_52 = QSqlRecord::isGenerated(this_01,in_stack_ffffffffffffff9c);
            }
            local_51 = local_52;
          }
        }
        local_21 = local_51;
      }
    }
  }
  else {
    local_21 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlTableModel::isDirty(const QModelIndex &index) const
{
    Q_D(const QSqlTableModel);
    if (!index.isValid())
        return false;

    const auto it = d->cache.constFind(index.row());
    if (it == d->cache.constEnd())
        return false;
    const QSqlTableModelPrivate::ModifiedRow &row = *it;
    if (row.submitted())
        return false;

    return row.op() == QSqlTableModelPrivate::Insert
           || row.op() == QSqlTableModelPrivate::Delete
           || (row.op() == QSqlTableModelPrivate::Update
               && row.rec().isGenerated(index.column()));
}